

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&>::
MatchAndExplain(ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&> *this,
               vector<int,_std::allocator<int>_> *container,MatchResultListener *listener)

{
  bool bVar1;
  bool bVar2;
  reference this_00;
  size_t sVar3;
  allocator_type *paVar4;
  ulong uVar5;
  MatchResultListener *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  string *s_1;
  size_t i;
  bool reason_printed;
  size_t actual_count;
  StringMatchResultListener s;
  bool match;
  bool mismatch_found;
  size_t exam_pos;
  const_iterator it;
  StlContainerReference stl_container;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  bool listener_interested;
  StringMatchResultListener *in_stack_fffffffffffffcf8;
  StringMatchResultListener *in_stack_fffffffffffffd00;
  allocator_type *in_stack_fffffffffffffd10;
  size_type in_stack_fffffffffffffd18;
  StringMatchResultListener *in_stack_fffffffffffffd20;
  int *in_stack_fffffffffffffd28;
  MatcherBase<const_int_&> *in_stack_fffffffffffffd30;
  size_t sVar6;
  allocator_type *local_268;
  size_t local_248;
  string local_240 [447];
  byte local_81;
  int *local_80;
  byte local_71;
  size_t local_70;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  const_reference local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  byte local_21;
  MatchResultListener *local_20;
  vector<int,_std::allocator<int>_> *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_21 = MatchResultListener::IsInterested(in_RDX);
  count((ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&> *)0x9b5340);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x9b535d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x9b5389);
  local_60 = StlContainerView<std::vector<int,_std::allocator<int>_>_>::ConstReference(local_18);
  local_68._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcf8);
  local_70 = 0;
  local_71 = 0;
  while( true ) {
    local_80 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcf8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffd00,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffcf8);
    sVar6 = local_70;
    bVar2 = false;
    if (bVar1) {
      sVar3 = count((ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&> *)
                    0x9b5426);
      bVar2 = sVar6 != sVar3;
    }
    if (!bVar2) goto LAB_009b55fc;
    if ((local_21 & 1) == 0) {
      std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>::
      operator[]((vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  *)(in_RDI + 8),local_70);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_68);
      local_81 = MatcherBase<const_int_&>::Matches
                           (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    }
    else {
      StringMatchResultListener::StringMatchResultListener(in_stack_fffffffffffffd20);
      std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>::
      operator[]((vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  *)(in_RDI + 8),local_70);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_68);
      local_81 = MatcherBase<const_int_&>::MatchAndExplain
                           (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                            &in_stack_fffffffffffffd20->super_MatchResultListener);
      StringMatchResultListener::str_abi_cxx11_(in_stack_fffffffffffffcf8);
      this_00 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_40,local_70);
      std::__cxx11::string::operator=((string *)this_00,local_240);
      std::__cxx11::string::~string(local_240);
      StringMatchResultListener::~StringMatchResultListener(in_stack_fffffffffffffd00);
    }
    if ((local_81 & 1) == 0) break;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_68);
    local_70 = local_70 + 1;
  }
  local_71 = 1;
LAB_009b55fc:
  local_248 = local_70;
  while( true ) {
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcf8);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffd00,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffcf8);
    if (!bVar2) break;
    local_248 = local_248 + 1;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_68);
  }
  sVar6 = local_248;
  sVar3 = count((ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&> *)0x9b5679);
  if (sVar6 == sVar3) {
    if ((local_71 & 1) == 0) {
      if ((local_21 & 1) != 0) {
        bVar2 = false;
        local_268 = (allocator_type *)0x0;
        while (in_stack_fffffffffffffd10 = local_268,
              paVar4 = (allocator_type *)
                       count((ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&>
                              *)0x9b5821), in_stack_fffffffffffffd10 != paVar4) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_40,(size_type)local_268);
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            if (bVar2) {
              MatchResultListener::operator<<
                        (&in_stack_fffffffffffffd00->super_MatchResultListener,
                         (char (*) [7])in_stack_fffffffffffffcf8);
            }
            MatchResultListener::operator<<
                      (&in_stack_fffffffffffffd00->super_MatchResultListener,
                       (char (*) [16])in_stack_fffffffffffffcf8);
            in_stack_fffffffffffffd00 =
                 (StringMatchResultListener *)
                 MatchResultListener::operator<<
                           (&in_stack_fffffffffffffd00->super_MatchResultListener,
                            (unsigned_long *)in_stack_fffffffffffffcf8);
            in_stack_fffffffffffffcf8 =
                 (StringMatchResultListener *)
                 MatchResultListener::operator<<
                           ((MatchResultListener *)in_stack_fffffffffffffd00,
                            (char (*) [11])in_stack_fffffffffffffcf8);
            MatchResultListener::operator<<
                      (&in_stack_fffffffffffffd00->super_MatchResultListener,
                       (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                        *)in_stack_fffffffffffffcf8);
            bVar2 = true;
          }
          local_268 = local_268 + 1;
        }
      }
      local_1 = 1;
    }
    else {
      if ((local_21 & 1) != 0) {
        MatchResultListener::operator<<
                  (&in_stack_fffffffffffffd00->super_MatchResultListener,
                   (char (*) [16])in_stack_fffffffffffffcf8);
        MatchResultListener::operator<<
                  (&in_stack_fffffffffffffd00->super_MatchResultListener,
                   (unsigned_long *)in_stack_fffffffffffffcf8);
        MatchResultListener::operator<<
                  (&in_stack_fffffffffffffd00->super_MatchResultListener,
                   (char (*) [15])in_stack_fffffffffffffcf8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_40,local_70);
        MatchResultListener::stream(local_20);
        PrintIfNotEmpty((string *)in_stack_fffffffffffffd00,(ostream *)in_stack_fffffffffffffcf8);
      }
      local_1 = 0;
    }
  }
  else {
    if (((local_21 & 1) != 0) && (local_248 != 0)) {
      MatchResultListener::operator<<
                (&in_stack_fffffffffffffd00->super_MatchResultListener,
                 (char (*) [11])in_stack_fffffffffffffcf8);
      Elements(sVar6);
      MatchResultListener::operator<<
                (&in_stack_fffffffffffffd00->super_MatchResultListener,
                 (Message *)in_stack_fffffffffffffcf8);
      Message::~Message((Message *)0x9b56f6);
    }
    local_1 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffd10);
  return (bool)(local_1 & 1);
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    auto it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }